

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O1

ion_err_t oafh_close(ion_file_hashmap_t *hash_map)

{
  ion_err_t iVar1;
  
  if ((FILE *)hash_map->file == (FILE *)0x0) {
    iVar1 = '\n';
  }
  else {
    fclose((FILE *)hash_map->file);
    free(hash_map);
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
oafh_close(
	ion_file_hashmap_t *hash_map
) {
	if (NULL != hash_map->file) {
		/* check to ensure that you are not freeing something already free */
		fclose(hash_map->file);
		free(hash_map);
		return err_ok;
	}
	else {
		return err_file_close_error;
	}
}